

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O0

void read_ref_pic_list_reordering(h264_stream_t *h,bs_t *b)

{
  slice_header_t *psVar1;
  int iVar2;
  uint32_t uVar3;
  bool bVar4;
  int local_28;
  int local_24;
  int n_1;
  int n;
  slice_header_t *sh;
  bs_t *b_local;
  h264_stream_t *h_local;
  
  psVar1 = h->sh;
  iVar2 = is_slice_type(psVar1->slice_type,2);
  if ((iVar2 == 0) && (iVar2 = is_slice_type(psVar1->slice_type,4), iVar2 == 0)) {
    uVar3 = bs_read_u1(b);
    (psVar1->rplr).ref_pic_list_reordering_flag_l0 = uVar3;
    if ((psVar1->rplr).ref_pic_list_reordering_flag_l0 != 0) {
      local_24 = -1;
      do {
        local_24 = local_24 + 1;
        uVar3 = bs_read_ue(b);
        (psVar1->rplr).reorder_l0.reordering_of_pic_nums_idc[local_24] = uVar3;
        if (((psVar1->rplr).reorder_l0.reordering_of_pic_nums_idc[local_24] == 0) ||
           ((psVar1->rplr).reorder_l0.reordering_of_pic_nums_idc[local_24] == 1)) {
          uVar3 = bs_read_ue(b);
          (psVar1->rplr).reorder_l0.abs_diff_pic_num_minus1[local_24] = uVar3;
        }
        else if ((psVar1->rplr).reorder_l0.reordering_of_pic_nums_idc[local_24] == 2) {
          uVar3 = bs_read_ue(b);
          (psVar1->rplr).reorder_l0.long_term_pic_num[local_24] = uVar3;
        }
        bVar4 = false;
        if ((psVar1->rplr).reorder_l0.reordering_of_pic_nums_idc[local_24] != 3) {
          iVar2 = bs_eof(b);
          bVar4 = iVar2 == 0;
        }
      } while (bVar4);
    }
  }
  iVar2 = is_slice_type(psVar1->slice_type,1);
  if (iVar2 != 0) {
    uVar3 = bs_read_u1(b);
    (psVar1->rplr).ref_pic_list_reordering_flag_l1 = uVar3;
    if ((psVar1->rplr).ref_pic_list_reordering_flag_l1 != 0) {
      local_28 = -1;
      do {
        local_28 = local_28 + 1;
        uVar3 = bs_read_ue(b);
        (psVar1->rplr).reorder_l1.reordering_of_pic_nums_idc[local_28] = uVar3;
        if (((psVar1->rplr).reorder_l1.reordering_of_pic_nums_idc[local_28] == 0) ||
           ((psVar1->rplr).reorder_l1.reordering_of_pic_nums_idc[local_28] == 1)) {
          uVar3 = bs_read_ue(b);
          (psVar1->rplr).reorder_l1.abs_diff_pic_num_minus1[local_28] = uVar3;
        }
        else if ((psVar1->rplr).reorder_l1.reordering_of_pic_nums_idc[local_28] == 2) {
          uVar3 = bs_read_ue(b);
          (psVar1->rplr).reorder_l1.long_term_pic_num[local_28] = uVar3;
        }
        bVar4 = false;
        if ((psVar1->rplr).reorder_l1.reordering_of_pic_nums_idc[local_28] != 3) {
          iVar2 = bs_eof(b);
          bVar4 = iVar2 == 0;
        }
      } while (bVar4);
    }
  }
  return;
}

Assistant:

void read_ref_pic_list_reordering(h264_stream_t* h, bs_t* b)
{
    slice_header_t* sh = h->sh;
    // FIXME should be an array

    if( ! is_slice_type( sh->slice_type, SH_SLICE_TYPE_I ) && ! is_slice_type( sh->slice_type, SH_SLICE_TYPE_SI ) )
    {
        sh->rplr.ref_pic_list_reordering_flag_l0 = bs_read_u1(b);
        if( sh->rplr.ref_pic_list_reordering_flag_l0 )
        {
            int n = -1;
            do
            {
                n++;
                sh->rplr.reorder_l0.reordering_of_pic_nums_idc[ n ] = bs_read_ue(b);
                if( sh->rplr.reorder_l0.reordering_of_pic_nums_idc[ n ] == 0 ||
                    sh->rplr.reorder_l0.reordering_of_pic_nums_idc[ n ] == 1 )
                {
                    sh->rplr.reorder_l0.abs_diff_pic_num_minus1[ n ] = bs_read_ue(b);
                }
                else if( sh->rplr.reorder_l0.reordering_of_pic_nums_idc[ n ] == 2 )
                {
                    sh->rplr.reorder_l0.long_term_pic_num[ n ] = bs_read_ue(b);
                }
            } while( sh->rplr.reorder_l0.reordering_of_pic_nums_idc[ n ] != 3 && ! bs_eof(b) );
        }
    }
    if( is_slice_type( sh->slice_type, SH_SLICE_TYPE_B ) )
    {
        sh->rplr.ref_pic_list_reordering_flag_l1 = bs_read_u1(b);
        if( sh->rplr.ref_pic_list_reordering_flag_l1 )
        {
            int n = -1;
            do
            {
                n++;
                sh->rplr.reorder_l1.reordering_of_pic_nums_idc[ n ] = bs_read_ue(b);
                if( sh->rplr.reorder_l1.reordering_of_pic_nums_idc[ n ] == 0 ||
                    sh->rplr.reorder_l1.reordering_of_pic_nums_idc[ n ] == 1 )
                {
                    sh->rplr.reorder_l1.abs_diff_pic_num_minus1[ n ] = bs_read_ue(b);
                }
                else if( sh->rplr.reorder_l1.reordering_of_pic_nums_idc[ n ] == 2 )
                {
                    sh->rplr.reorder_l1.long_term_pic_num[ n ] = bs_read_ue(b);
                }
            } while( sh->rplr.reorder_l1.reordering_of_pic_nums_idc[ n ] != 3 && ! bs_eof(b) );
        }
    }
}